

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_image_dds.cxx
# Opt level: O2

bool __thiscall xray_re::xr_image::load_dds(xr_image *this,string *path)

{
  bool bVar1;
  uint uVar2;
  rgba32 *prVar3;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d8d_for_Color32_0_0 *paVar4;
  ulong uVar5;
  Image image;
  DirectDrawSurface dds;
  Image local_e0;
  DirectDrawSurface local_c8;
  
  nv::DirectDrawSurface::DirectDrawSurface(&local_c8,(path->_M_dataplus)._M_p);
  bVar1 = nv::DirectDrawSurface::isValid(&local_c8);
  if (bVar1) {
    bVar1 = nv::DirectDrawSurface::isTexture2D(&local_c8);
    if (bVar1) {
      nv::Image::Image(&local_e0);
      nv::DirectDrawSurface::mipmap(&local_c8,&local_e0,0,0);
      uVar2 = nv::Image::width(&local_e0);
      this->m_width = uVar2;
      uVar2 = nv::Image::height(&local_e0);
      this->m_height = uVar2;
      uVar5 = (ulong)(uVar2 * this->m_width);
      prVar3 = (rgba32 *)operator_new__(uVar5 * 4);
      this->m_data = prVar3;
      while (uVar5 != 0) {
        uVar5 = uVar5 - 1;
        paVar4 = (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d8d_for_Color32_0_0 *)
                 nv::Image::pixel(&local_e0,(uint)uVar5);
        ((anon_union_4_2_12391d8d_for_Color32_0 *)(this->m_data + (uVar5 & 0xffffffff)))->field_0 =
             *paVar4;
      }
      nv::Image::~Image(&local_e0);
      bVar1 = true;
      goto LAB_00155357;
    }
  }
  bVar1 = false;
LAB_00155357:
  nv::DirectDrawSurface::~DirectDrawSurface(&local_c8);
  return bVar1;
}

Assistant:

bool xr_image::load_dds(const std::string& path)
{
	nv::DirectDrawSurface dds(path.c_str());
	if (!dds.isValid() || !dds.isTexture2D())
		return false;
	nv::Image image;
	dds.mipmap(&image, 0, 0);
	m_width = image.width();
	m_height = image.height();
	m_data = new rgba32[m_width*m_height];
	for (unsigned i = m_height*m_width; i > 0;) {
		const nv::Color32& pix = image.pixel(--i);
		m_data[i] = pix.u;
	}
	return true;
}